

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects.cpp
# Opt level: O0

void Sparkle(byte red,byte green,byte blue,int SpeedDelay)

{
  int ledIndex;
  int Pixel;
  int SpeedDelay_local;
  byte blue_local;
  byte green_local;
  byte red_local;
  
  ledIndex = myRandom(0,0x18);
  setPixel(ledIndex,red,green,blue);
  showStrip();
  delay(SpeedDelay);
  setPixel(ledIndex,'\0','\0','\0');
  return;
}

Assistant:

void Sparkle(byte red, byte green, byte blue, int SpeedDelay) {
    int Pixel =myRandom(0, NUM_LEDS);
    setPixel(Pixel,red,green,blue);
    showStrip();
    delay(SpeedDelay);
    setPixel(Pixel,0,0,0);
}